

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIfif.c
# Opt level: O2

float Abc_ObjDelayDegree(Abc_IffMan_t *p,Abc_Obj_t *pObj,int d)

{
  int fDelay1;
  Abc_Obj_t *pObj_00;
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Abc_Obj_t *ppNodes [6];
  Abc_Obj_t *local_68 [7];
  
  if ((-1 < d) && (fDelay1 = p->pPars->nDegree, d <= fDelay1)) {
    Abc_ObjSortByDelay(p,pObj,fDelay1,local_68);
    fVar2 = 0.0;
    for (lVar1 = 0; lVar1 < (pObj->vFanins).nSize; lVar1 = lVar1 + 1) {
      pObj_00 = local_68[lVar1];
      fVar3 = Abc_IffDelay(p,pObj_00,p->pPars->nDegree);
      fVar3 = fVar3 + p->pPars->pLutDelays[lVar1];
      if (lVar1 == 0 && d != 0) {
        fVar4 = Abc_IffDelay(p,pObj_00,d + -1);
        fVar4 = (fVar4 + p->pPars->pLutDelays[0]) - p->pPars->DelayWire;
        if (fVar4 <= fVar3) {
          fVar3 = fVar4;
        }
      }
      if (fVar2 <= fVar3) {
        fVar2 = fVar3;
      }
    }
    return fVar2;
  }
  __assert_fail("d >= 0 && d <= p->pPars->nDegree",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcIfif.c"
                ,0xe8,"float Abc_ObjDelayDegree(Abc_IffMan_t *, Abc_Obj_t *, int)");
}

Assistant:

float Abc_ObjDelayDegree( Abc_IffMan_t * p, Abc_Obj_t * pObj, int d )
{
    int i;
    float Delay0 = 0, DelayNew;
    Abc_Obj_t * ppNodes[6];
    assert( d >= 0 && d <= p->pPars->nDegree );
    Abc_ObjSortByDelay( p, pObj, p->pPars->nDegree, ppNodes );
    for ( i = 0; i < Abc_ObjFaninNum(pObj); i++ )
    {
        DelayNew = Abc_IffDelay(p, ppNodes[i], p->pPars->nDegree) + p->pPars->pLutDelays[i];
        if ( i == 0 && d > 0 )
            DelayNew = Abc_MinFloat(DelayNew, Abc_IffDelay(p, ppNodes[i], d-1) + p->pPars->pLutDelays[i] - p->pPars->DelayWire );
        Delay0 = Abc_MaxFloat( Delay0, DelayNew );
    }
    return Delay0;
}